

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# linenoise.cpp
# Opt level: O0

void __thiscall duckdb::Linenoise::EditBackspace(Linenoise *this)

{
  size_t sVar1;
  size_t sVar2;
  Linenoise *in_RDI;
  size_t char_sz;
  size_t new_pos;
  
  if ((in_RDI->pos != 0) && (in_RDI->len != 0)) {
    sVar2 = PrevChar((Linenoise *)0x1f9710);
    sVar1 = in_RDI->pos;
    memmove(in_RDI->buf + sVar2,in_RDI->buf + in_RDI->pos,in_RDI->len - in_RDI->pos);
    in_RDI->len = in_RDI->len - (sVar1 - sVar2);
    in_RDI->pos = sVar2;
    in_RDI->buf[in_RDI->len] = '\0';
    RefreshLine(in_RDI);
  }
  return;
}

Assistant:

void Linenoise::EditBackspace() {
	if (pos > 0 && len > 0) {
		size_t new_pos = PrevChar();
		size_t char_sz = pos - new_pos;
		memmove(buf + new_pos, buf + pos, len - pos);
		len -= char_sz;
		pos = new_pos;
		buf[len] = '\0';
		RefreshLine();
	}
}